

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_log_height(t_my_numbox *x,t_floatarg lh)

{
  double dVar1;
  float fVar2;
  
  fVar2 = 10.0;
  if (10.0 <= lh) {
    fVar2 = lh;
  }
  x->x_log_height = (int)fVar2;
  if (x->x_lin0_log1 == 0) {
    dVar1 = 1.0;
  }
  else {
    dVar1 = log(x->x_max / x->x_min);
    dVar1 = exp(dVar1 / (double)x->x_log_height);
  }
  x->x_k = dVar1;
  return;
}

Assistant:

static void my_numbox_log_height(t_my_numbox *x, t_floatarg lh)
{
    if(lh < 10.0)
        lh = 10.0;
    x->x_log_height = (int)lh;
    if(x->x_lin0_log1)
        x->x_k = exp(log(x->x_max/x->x_min)/(double)(x->x_log_height));
    else
        x->x_k = 1.0;
}